

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<4,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMvIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  undefined8 uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  float fVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined4 uVar57;
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar59 [32];
  undefined1 auVar63 [64];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [32];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_b6c;
  Ray *local_b68;
  RTCIntersectArguments *local_b60;
  ulong local_b58;
  undefined1 local_b50 [16];
  undefined1 local_b40 [16];
  undefined1 local_b30 [16];
  undefined1 local_b20 [16];
  float local_b10;
  float fStack_b0c;
  float fStack_b08;
  float fStack_b04;
  Geometry *local_b00;
  ulong local_af8;
  ulong local_af0;
  ulong *local_ae8;
  long local_ae0;
  long local_ad8;
  ulong local_ad0;
  Scene *local_ac8;
  undefined4 local_ac0;
  undefined4 local_abc;
  undefined4 local_ab8;
  undefined4 local_ab4;
  undefined4 local_ab0;
  undefined4 local_aac;
  uint local_aa8;
  uint local_aa4;
  uint local_aa0;
  RTCFilterFunctionNArguments local_a90;
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  byte local_900;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820;
  ulong local_800;
  ulong local_7f8 [249];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar25 [16];
  undefined1 auVar58 [64];
  
  local_800 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_800 != 8) {
    fVar60 = ray->tfar;
    if (0.0 <= fVar60) {
      aVar8 = (ray->dir).field_0;
      auVar29 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar23._8_4_ = 0x7fffffff;
      auVar23._0_8_ = 0x7fffffff7fffffff;
      auVar23._12_4_ = 0x7fffffff;
      auVar23 = vandps_avx512vl((undefined1  [16])aVar8,auVar23);
      auVar24._8_4_ = 0x219392ef;
      auVar24._0_8_ = 0x219392ef219392ef;
      auVar24._12_4_ = 0x219392ef;
      uVar17 = vcmpps_avx512vl(auVar23,auVar24,1);
      local_ae8 = local_7f8;
      auVar26._8_4_ = 0x3f800000;
      auVar26._0_8_ = 0x3f8000003f800000;
      auVar26._12_4_ = 0x3f800000;
      auVar23 = vdivps_avx(auVar26,(undefined1  [16])aVar8);
      auVar24 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar22 = (bool)((byte)uVar17 & 1);
      auVar25._0_4_ = (uint)bVar22 * auVar24._0_4_ | (uint)!bVar22 * auVar23._0_4_;
      bVar22 = (bool)((byte)(uVar17 >> 1) & 1);
      auVar25._4_4_ = (uint)bVar22 * auVar24._4_4_ | (uint)!bVar22 * auVar23._4_4_;
      bVar22 = (bool)((byte)(uVar17 >> 2) & 1);
      auVar25._8_4_ = (uint)bVar22 * auVar24._8_4_ | (uint)!bVar22 * auVar23._8_4_;
      bVar22 = (bool)((byte)(uVar17 >> 3) & 1);
      auVar25._12_4_ = (uint)bVar22 * auVar24._12_4_ | (uint)!bVar22 * auVar23._12_4_;
      auVar28._8_4_ = 0x3f7ffffa;
      auVar28._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar28._12_4_ = 0x3f7ffffa;
      auVar26 = vmulps_avx512vl(auVar25,auVar28);
      auVar27._8_4_ = 0x3f800003;
      auVar27._0_8_ = 0x3f8000033f800003;
      auVar27._12_4_ = 0x3f800003;
      auVar27 = vmulps_avx512vl(auVar25,auVar27);
      auVar23 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[0]));
      auVar70 = ZEXT1664(auVar23);
      auVar23 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar71 = ZEXT1664(auVar23);
      auVar23 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
      auVar72 = ZEXT1664(auVar23);
      auVar23 = vbroadcastss_avx512vl(auVar26);
      auVar73 = ZEXT1664(auVar23);
      auVar23 = vmovshdup_avx(auVar26);
      auVar24 = vshufps_avx512vl(auVar26,auVar26,0x55);
      auVar74 = ZEXT1664(auVar24);
      auVar24 = vshufpd_avx(auVar26,auVar26,1);
      auVar28 = vshufps_avx512vl(auVar26,auVar26,0xaa);
      auVar75 = ZEXT1664(auVar28);
      fVar54 = auVar27._0_4_;
      auVar28 = vshufps_avx(auVar27,auVar27,0x55);
      auVar67 = ZEXT1664(auVar28);
      auVar28 = vshufps_avx(auVar27,auVar27,0xaa);
      auVar68 = ZEXT1664(auVar28);
      local_af0 = (ulong)(auVar26._0_4_ < 0.0) << 4;
      local_af8 = (ulong)(auVar23._0_4_ < 0.0) << 4 | 0x20;
      uVar17 = (ulong)(auVar24._0_4_ < 0.0) << 4 | 0x40;
      uVar20 = local_af0 ^ 0x10;
      uVar21 = local_af8 ^ 0x10;
      uVar57 = auVar29._0_4_;
      auVar58 = ZEXT1664(CONCAT412(uVar57,CONCAT48(uVar57,CONCAT44(uVar57,uVar57))));
      auVar63 = ZEXT1664(CONCAT412(fVar60,CONCAT48(fVar60,CONCAT44(fVar60,fVar60))));
      local_b68 = ray;
      fVar60 = fVar54;
      fVar61 = fVar54;
      fVar62 = fVar54;
      do {
        uVar19 = local_ae8[-1];
        local_ae8 = local_ae8 + -1;
        while ((uVar19 & 8) == 0) {
          auVar23 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar19 + 0x20 + local_af0),auVar70._0_16_
                                   );
          auVar23 = vmulps_avx512vl(auVar73._0_16_,auVar23);
          auVar29 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar19 + 0x20 + local_af8),auVar71._0_16_
                                   );
          auVar29 = vmulps_avx512vl(auVar74._0_16_,auVar29);
          auVar23 = vmaxps_avx(auVar23,auVar29);
          auVar29 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar19 + 0x20 + uVar17),auVar72._0_16_);
          auVar29 = vmulps_avx512vl(auVar75._0_16_,auVar29);
          auVar29 = vmaxps_avx(auVar29,auVar58._0_16_);
          auVar23 = vmaxps_avx(auVar23,auVar29);
          auVar29 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar19 + 0x20 + uVar20),auVar70._0_16_);
          auVar53._0_4_ = fVar54 * auVar29._0_4_;
          auVar53._4_4_ = fVar60 * auVar29._4_4_;
          auVar53._8_4_ = fVar61 * auVar29._8_4_;
          auVar53._12_4_ = fVar62 * auVar29._12_4_;
          auVar29 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar19 + 0x20 + uVar21),auVar71._0_16_);
          auVar55._0_4_ = auVar67._0_4_ * auVar29._0_4_;
          auVar55._4_4_ = auVar67._4_4_ * auVar29._4_4_;
          auVar55._8_4_ = auVar67._8_4_ * auVar29._8_4_;
          auVar55._12_4_ = auVar67._12_4_ * auVar29._12_4_;
          auVar29 = vminps_avx(auVar53,auVar55);
          auVar24 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar19 + 0x20 + (uVar17 ^ 0x10)),
                                    auVar72._0_16_);
          auVar56._0_4_ = auVar68._0_4_ * auVar24._0_4_;
          auVar56._4_4_ = auVar68._4_4_ * auVar24._4_4_;
          auVar56._8_4_ = auVar68._8_4_ * auVar24._8_4_;
          auVar56._12_4_ = auVar68._12_4_ * auVar24._12_4_;
          auVar24 = vminps_avx(auVar56,auVar63._0_16_);
          auVar29 = vminps_avx(auVar29,auVar24);
          uVar16 = vcmpps_avx512vl(auVar23,auVar29,2);
          if ((char)uVar16 == '\0') goto LAB_006844aa;
          uVar13 = uVar19 & 0xfffffffffffffff0;
          lVar18 = 0;
          for (uVar19 = uVar16; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
            lVar18 = lVar18 + 1;
          }
          uVar19 = *(ulong *)(uVar13 + lVar18 * 8);
          uVar15 = (uint)uVar16 - 1 & (uint)uVar16;
          uVar16 = (ulong)uVar15;
          if (uVar15 != 0) {
            *local_ae8 = uVar19;
            lVar18 = 0;
            for (; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
              lVar18 = lVar18 + 1;
            }
            uVar15 = uVar15 - 1 & uVar15;
            uVar16 = (ulong)uVar15;
            bVar22 = uVar15 == 0;
            while( true ) {
              local_ae8 = local_ae8 + 1;
              uVar19 = *(ulong *)(uVar13 + lVar18 * 8);
              if (bVar22) break;
              *local_ae8 = uVar19;
              lVar18 = 0;
              for (uVar19 = uVar16; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                lVar18 = lVar18 + 1;
              }
              uVar16 = uVar16 - 1 & uVar16;
              bVar22 = uVar16 == 0;
            }
          }
        }
        local_ad8 = (ulong)((uint)uVar19 & 0xf) - 8;
        if (local_ad8 != 0) {
          uVar19 = uVar19 & 0xfffffffffffffff0;
          local_ae0 = 0;
          local_b10 = fVar54;
          fStack_b0c = fVar60;
          fStack_b08 = fVar61;
          fStack_b04 = fVar62;
          local_b20 = auVar67._0_16_;
          local_b30 = auVar68._0_16_;
          local_b40 = auVar58._0_16_;
          local_b50 = auVar63._0_16_;
          do {
            lVar14 = local_ae0 * 0xe0;
            lVar18 = uVar19 + 0xd0 + lVar14;
            local_a00 = *(undefined8 *)(lVar18 + 0x10);
            uStack_9f8 = *(undefined8 *)(lVar18 + 0x18);
            lVar18 = uVar19 + 0xc0 + lVar14;
            local_9e0 = *(undefined8 *)(lVar18 + 0x10);
            uStack_9d8 = *(undefined8 *)(lVar18 + 0x18);
            uStack_9d0 = local_9e0;
            uStack_9c8 = uStack_9d8;
            uStack_9f0 = local_a00;
            uStack_9e8 = uStack_9f8;
            auVar52._16_16_ = *(undefined1 (*) [16])(uVar19 + 0x60 + lVar14);
            auVar52._0_16_ = *(undefined1 (*) [16])(uVar19 + lVar14);
            auVar32._16_16_ = *(undefined1 (*) [16])(uVar19 + 0x70 + lVar14);
            auVar32._0_16_ = *(undefined1 (*) [16])(uVar19 + 0x10 + lVar14);
            auVar33._16_16_ = *(undefined1 (*) [16])(uVar19 + 0x80 + lVar14);
            auVar33._0_16_ = *(undefined1 (*) [16])(uVar19 + 0x20 + lVar14);
            auVar23 = *(undefined1 (*) [16])(uVar19 + 0x30 + lVar14);
            auVar35._16_16_ = auVar23;
            auVar35._0_16_ = auVar23;
            auVar23 = *(undefined1 (*) [16])(uVar19 + 0x40 + lVar14);
            auVar36._16_16_ = auVar23;
            auVar36._0_16_ = auVar23;
            auVar23 = *(undefined1 (*) [16])(uVar19 + 0x50 + lVar14);
            auVar37._16_16_ = auVar23;
            auVar37._0_16_ = auVar23;
            auVar23 = *(undefined1 (*) [16])(uVar19 + 0x90 + lVar14);
            auVar38._16_16_ = auVar23;
            auVar38._0_16_ = auVar23;
            auVar23 = *(undefined1 (*) [16])(uVar19 + 0xa0 + lVar14);
            auVar39._16_16_ = auVar23;
            auVar39._0_16_ = auVar23;
            auVar23 = *(undefined1 (*) [16])(uVar19 + 0xb0 + lVar14);
            auVar40._16_16_ = auVar23;
            auVar40._0_16_ = auVar23;
            uVar57 = *(undefined4 *)&(local_b68->org).field_0;
            auVar41._4_4_ = uVar57;
            auVar41._0_4_ = uVar57;
            auVar41._8_4_ = uVar57;
            auVar41._12_4_ = uVar57;
            auVar41._16_4_ = uVar57;
            auVar41._20_4_ = uVar57;
            auVar41._24_4_ = uVar57;
            auVar41._28_4_ = uVar57;
            auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(local_b68->org).field_0.m128[1]));
            auVar31 = vbroadcastss_avx512vl(ZEXT416((uint)(local_b68->org).field_0.m128[2]));
            uVar57 = *(undefined4 *)&(local_b68->dir).field_0;
            auVar64._4_4_ = uVar57;
            auVar64._0_4_ = uVar57;
            auVar64._8_4_ = uVar57;
            auVar64._12_4_ = uVar57;
            auVar64._16_4_ = uVar57;
            auVar64._20_4_ = uVar57;
            auVar64._24_4_ = uVar57;
            auVar64._28_4_ = uVar57;
            uVar57 = *(undefined4 *)((long)&(local_b68->dir).field_0 + 4);
            auVar66._4_4_ = uVar57;
            auVar66._0_4_ = uVar57;
            auVar66._8_4_ = uVar57;
            auVar66._12_4_ = uVar57;
            auVar66._16_4_ = uVar57;
            auVar66._20_4_ = uVar57;
            auVar66._24_4_ = uVar57;
            auVar66._28_4_ = uVar57;
            fVar7 = (local_b68->dir).field_0.m128[2];
            auVar69._4_4_ = fVar7;
            auVar69._0_4_ = fVar7;
            auVar69._8_4_ = fVar7;
            auVar69._12_4_ = fVar7;
            auVar69._16_4_ = fVar7;
            auVar69._20_4_ = fVar7;
            auVar69._24_4_ = fVar7;
            auVar69._28_4_ = fVar7;
            auVar52 = vsubps_avx(auVar52,auVar41);
            auVar32 = vsubps_avx512vl(auVar32,auVar30);
            auVar33 = vsubps_avx512vl(auVar33,auVar31);
            auVar34 = vsubps_avx512vl(auVar35,auVar41);
            auVar35 = vsubps_avx512vl(auVar36,auVar30);
            auVar36 = vsubps_avx512vl(auVar37,auVar31);
            auVar37 = vsubps_avx512vl(auVar38,auVar41);
            auVar38 = vsubps_avx512vl(auVar39,auVar30);
            auVar31 = vsubps_avx512vl(auVar40,auVar31);
            auVar39 = vsubps_avx512vl(auVar37,auVar52);
            auVar40 = vsubps_avx512vl(auVar38,auVar32);
            auVar30 = vsubps_avx(auVar31,auVar33);
            auVar41 = vsubps_avx512vl(auVar52,auVar34);
            auVar42 = vsubps_avx512vl(auVar32,auVar35);
            auVar43 = vsubps_avx512vl(auVar33,auVar36);
            auVar44 = vsubps_avx512vl(auVar34,auVar37);
            auVar45 = vsubps_avx512vl(auVar35,auVar38);
            auVar46 = vsubps_avx512vl(auVar36,auVar31);
            auVar47 = vaddps_avx512vl(auVar37,auVar52);
            auVar48 = vaddps_avx512vl(auVar38,auVar32);
            auVar49 = vaddps_avx512vl(auVar31,auVar33);
            auVar50 = vmulps_avx512vl(auVar48,auVar30);
            auVar50 = vfmsub231ps_avx512vl(auVar50,auVar40,auVar49);
            auVar49 = vmulps_avx512vl(auVar49,auVar39);
            auVar51 = vfmsub231ps_avx512vl(auVar49,auVar30,auVar47);
            auVar49._4_4_ = auVar40._4_4_ * auVar47._4_4_;
            auVar49._0_4_ = auVar40._0_4_ * auVar47._0_4_;
            auVar49._8_4_ = auVar40._8_4_ * auVar47._8_4_;
            auVar49._12_4_ = auVar40._12_4_ * auVar47._12_4_;
            auVar49._16_4_ = auVar40._16_4_ * auVar47._16_4_;
            auVar49._20_4_ = auVar40._20_4_ * auVar47._20_4_;
            auVar49._24_4_ = auVar40._24_4_ * auVar47._24_4_;
            auVar49._28_4_ = auVar47._28_4_;
            auVar23 = vfmsub231ps_fma(auVar49,auVar39,auVar48);
            auVar48._0_4_ = fVar7 * auVar23._0_4_;
            auVar48._4_4_ = fVar7 * auVar23._4_4_;
            auVar48._8_4_ = fVar7 * auVar23._8_4_;
            auVar48._12_4_ = fVar7 * auVar23._12_4_;
            auVar48._16_4_ = fVar7 * 0.0;
            auVar48._20_4_ = fVar7 * 0.0;
            auVar48._24_4_ = fVar7 * 0.0;
            auVar48._28_4_ = 0;
            auVar49 = vfmadd231ps_avx512vl(auVar48,auVar66,auVar51);
            local_9c0 = vfmadd231ps_avx512vl(auVar49,auVar64,auVar50);
            auVar49 = vaddps_avx512vl(auVar52,auVar34);
            auVar47 = vaddps_avx512vl(auVar32,auVar35);
            auVar48 = vaddps_avx512vl(auVar33,auVar36);
            auVar50 = vmulps_avx512vl(auVar47,auVar43);
            auVar50 = vfmsub231ps_avx512vl(auVar50,auVar42,auVar48);
            auVar48 = vmulps_avx512vl(auVar48,auVar41);
            auVar48 = vfmsub231ps_avx512vl(auVar48,auVar43,auVar49);
            auVar49 = vmulps_avx512vl(auVar49,auVar42);
            auVar49 = vfmsub231ps_avx512vl(auVar49,auVar41,auVar47);
            auVar51 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar47._4_4_ = fVar7 * auVar49._4_4_;
            auVar47._0_4_ = fVar7 * auVar49._0_4_;
            auVar47._8_4_ = fVar7 * auVar49._8_4_;
            auVar47._12_4_ = fVar7 * auVar49._12_4_;
            auVar47._16_4_ = fVar7 * auVar49._16_4_;
            auVar47._20_4_ = fVar7 * auVar49._20_4_;
            auVar47._24_4_ = fVar7 * auVar49._24_4_;
            auVar47._28_4_ = auVar49._28_4_;
            auVar49 = vfmadd231ps_avx512vl(auVar47,auVar66,auVar48);
            local_9a0 = vfmadd231ps_avx512vl(auVar49,auVar64,auVar50);
            auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar47 = vaddps_avx512vl(auVar34,auVar37);
            auVar35 = vaddps_avx512vl(auVar35,auVar38);
            auVar31 = vaddps_avx512vl(auVar36,auVar31);
            auVar34 = vmulps_avx512vl(auVar35,auVar46);
            auVar36 = vfmsub231ps_avx512vl(auVar34,auVar45,auVar31);
            auVar34._4_4_ = auVar31._4_4_ * auVar44._4_4_;
            auVar34._0_4_ = auVar31._0_4_ * auVar44._0_4_;
            auVar34._8_4_ = auVar31._8_4_ * auVar44._8_4_;
            auVar34._12_4_ = auVar31._12_4_ * auVar44._12_4_;
            auVar34._16_4_ = auVar31._16_4_ * auVar44._16_4_;
            auVar34._20_4_ = auVar31._20_4_ * auVar44._20_4_;
            auVar34._24_4_ = auVar31._24_4_ * auVar44._24_4_;
            auVar34._28_4_ = auVar31._28_4_;
            auVar31 = vfmsub231ps_avx512vl(auVar34,auVar46,auVar47);
            auVar47 = vmulps_avx512vl(auVar47,auVar45);
            auVar47 = vfmsub231ps_avx512vl(auVar47,auVar44,auVar35);
            auVar47 = vmulps_avx512vl(auVar69,auVar47);
            auVar31 = vfmadd231ps_avx512vl(auVar47,auVar66,auVar31);
            auVar47 = vfmadd231ps_avx512vl(auVar31,auVar64,auVar36);
            auVar50._0_4_ = local_9a0._0_4_ + local_9c0._0_4_;
            auVar50._4_4_ = local_9a0._4_4_ + local_9c0._4_4_;
            auVar50._8_4_ = local_9a0._8_4_ + local_9c0._8_4_;
            auVar50._12_4_ = local_9a0._12_4_ + local_9c0._12_4_;
            auVar50._16_4_ = local_9a0._16_4_ + local_9c0._16_4_;
            auVar50._20_4_ = local_9a0._20_4_ + local_9c0._20_4_;
            auVar50._24_4_ = local_9a0._24_4_ + local_9c0._24_4_;
            auVar50._28_4_ = local_9a0._28_4_ + local_9c0._28_4_;
            local_980 = vaddps_avx512vl(auVar47,auVar50);
            vandps_avx512vl(local_980,auVar49);
            auVar31._8_4_ = 0x34000000;
            auVar31._0_8_ = 0x3400000034000000;
            auVar31._12_4_ = 0x34000000;
            auVar31._16_4_ = 0x34000000;
            auVar31._20_4_ = 0x34000000;
            auVar31._24_4_ = 0x34000000;
            auVar31._28_4_ = 0x34000000;
            auVar31 = vmulps_avx512vl(local_980,auVar31);
            auVar34 = vminps_avx512vl(local_9c0,local_9a0);
            auVar34 = vminps_avx512vl(auVar34,auVar47);
            auVar35 = vxorps_avx512vl(auVar31,auVar51);
            uVar9 = vcmpps_avx512vl(auVar34,auVar35,5);
            auVar34 = vmaxps_avx512vl(local_9c0,local_9a0);
            auVar47 = vmaxps_avx512vl(auVar34,auVar47);
            uVar10 = vcmpps_avx512vl(auVar47,auVar31,2);
            local_900 = (byte)uVar9 | (byte)uVar10;
            fVar60 = fStack_b0c;
            fVar61 = fStack_b08;
            fVar62 = fStack_b04;
            fVar54 = local_b10;
            if (local_900 == 0) {
LAB_00684478:
              auVar67 = ZEXT1664(local_b20);
              auVar68 = ZEXT1664(local_b30);
              auVar58 = ZEXT1664(local_b40);
              auVar63 = ZEXT1664(local_b50);
            }
            else {
              auVar31 = vmulps_avx512vl(auVar30,auVar42);
              auVar47 = vmulps_avx512vl(auVar39,auVar43);
              auVar34 = vmulps_avx512vl(auVar40,auVar41);
              auVar35 = vmulps_avx512vl(auVar43,auVar45);
              auVar36 = vmulps_avx512vl(auVar41,auVar46);
              auVar37 = vmulps_avx512vl(auVar42,auVar44);
              auVar38 = vfmsub213ps_avx512vl(auVar40,auVar43,auVar31);
              auVar30 = vfmsub213ps_avx512vl(auVar30,auVar41,auVar47);
              auVar39 = vfmsub213ps_avx512vl(auVar39,auVar42,auVar34);
              auVar40 = vfmsub213ps_avx512vl(auVar46,auVar42,auVar35);
              auVar42 = vfmsub213ps_avx512vl(auVar44,auVar43,auVar36);
              auVar41 = vfmsub213ps_avx512vl(auVar45,auVar41,auVar37);
              vandps_avx512vl(auVar31,auVar49);
              vandps_avx512vl(auVar35,auVar49);
              uVar16 = vcmpps_avx512vl(auVar41,auVar41,1);
              vandps_avx512vl(auVar47,auVar49);
              vandps_avx512vl(auVar36,auVar49);
              auVar31 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              uVar13 = vcmpps_avx512vl(auVar41,auVar41,1);
              vandps_avx512vl(auVar34,auVar49);
              vandps_avx512vl(auVar37,auVar49);
              uVar11 = vcmpps_avx512vl(auVar31,auVar31,1);
              bVar22 = (bool)((byte)uVar16 & 1);
              local_960._0_4_ =
                   (float)((uint)bVar22 * auVar38._0_4_ | (uint)!bVar22 * auVar40._0_4_);
              bVar22 = (bool)((byte)(uVar16 >> 1) & 1);
              local_960._4_4_ =
                   (float)((uint)bVar22 * auVar38._4_4_ | (uint)!bVar22 * auVar40._4_4_);
              bVar22 = (bool)((byte)(uVar16 >> 2) & 1);
              local_960._8_4_ =
                   (float)((uint)bVar22 * auVar38._8_4_ | (uint)!bVar22 * auVar40._8_4_);
              bVar22 = (bool)((byte)(uVar16 >> 3) & 1);
              local_960._12_4_ =
                   (float)((uint)bVar22 * auVar38._12_4_ | (uint)!bVar22 * auVar40._12_4_);
              bVar22 = (bool)((byte)(uVar16 >> 4) & 1);
              local_960._16_4_ =
                   (float)((uint)bVar22 * auVar38._16_4_ | (uint)!bVar22 * auVar40._16_4_);
              bVar22 = (bool)((byte)(uVar16 >> 5) & 1);
              local_960._20_4_ =
                   (float)((uint)bVar22 * auVar38._20_4_ | (uint)!bVar22 * auVar40._20_4_);
              bVar22 = (bool)((byte)(uVar16 >> 6) & 1);
              local_960._24_4_ =
                   (float)((uint)bVar22 * auVar38._24_4_ | (uint)!bVar22 * auVar40._24_4_);
              bVar22 = SUB81(uVar16 >> 7,0);
              local_960._28_4_ = (uint)bVar22 * auVar38._28_4_ | (uint)!bVar22 * auVar40._28_4_;
              bVar22 = (bool)((byte)uVar13 & 1);
              local_940._0_4_ =
                   (float)((uint)bVar22 * auVar30._0_4_ | (uint)!bVar22 * auVar42._0_4_);
              bVar22 = (bool)((byte)(uVar13 >> 1) & 1);
              local_940._4_4_ =
                   (float)((uint)bVar22 * auVar30._4_4_ | (uint)!bVar22 * auVar42._4_4_);
              bVar22 = (bool)((byte)(uVar13 >> 2) & 1);
              local_940._8_4_ =
                   (float)((uint)bVar22 * auVar30._8_4_ | (uint)!bVar22 * auVar42._8_4_);
              bVar22 = (bool)((byte)(uVar13 >> 3) & 1);
              local_940._12_4_ =
                   (float)((uint)bVar22 * auVar30._12_4_ | (uint)!bVar22 * auVar42._12_4_);
              bVar22 = (bool)((byte)(uVar13 >> 4) & 1);
              local_940._16_4_ =
                   (float)((uint)bVar22 * auVar30._16_4_ | (uint)!bVar22 * auVar42._16_4_);
              bVar22 = (bool)((byte)(uVar13 >> 5) & 1);
              local_940._20_4_ =
                   (float)((uint)bVar22 * auVar30._20_4_ | (uint)!bVar22 * auVar42._20_4_);
              bVar22 = (bool)((byte)(uVar13 >> 6) & 1);
              local_940._24_4_ =
                   (float)((uint)bVar22 * auVar30._24_4_ | (uint)!bVar22 * auVar42._24_4_);
              bVar22 = SUB81(uVar13 >> 7,0);
              local_940._28_4_ = (uint)bVar22 * auVar30._28_4_ | (uint)!bVar22 * auVar42._28_4_;
              bVar22 = (bool)((byte)uVar11 & 1);
              local_920._0_4_ =
                   (float)((uint)bVar22 * auVar39._0_4_ | (uint)!bVar22 * auVar41._0_4_);
              bVar22 = (bool)((byte)(uVar11 >> 1) & 1);
              local_920._4_4_ =
                   (float)((uint)bVar22 * auVar39._4_4_ | (uint)!bVar22 * auVar41._4_4_);
              bVar22 = (bool)((byte)(uVar11 >> 2) & 1);
              local_920._8_4_ =
                   (float)((uint)bVar22 * auVar39._8_4_ | (uint)!bVar22 * auVar41._8_4_);
              bVar22 = (bool)((byte)(uVar11 >> 3) & 1);
              local_920._12_4_ =
                   (float)((uint)bVar22 * auVar39._12_4_ | (uint)!bVar22 * auVar41._12_4_);
              bVar22 = (bool)((byte)(uVar11 >> 4) & 1);
              local_920._16_4_ =
                   (float)((uint)bVar22 * auVar39._16_4_ | (uint)!bVar22 * auVar41._16_4_);
              bVar22 = (bool)((byte)(uVar11 >> 5) & 1);
              local_920._20_4_ =
                   (float)((uint)bVar22 * auVar39._20_4_ | (uint)!bVar22 * auVar41._20_4_);
              bVar22 = (bool)((byte)(uVar11 >> 6) & 1);
              local_920._24_4_ =
                   (float)((uint)bVar22 * auVar39._24_4_ | (uint)!bVar22 * auVar41._24_4_);
              bVar22 = SUB81(uVar11 >> 7,0);
              local_920._28_4_ = (uint)bVar22 * auVar39._28_4_ | (uint)!bVar22 * auVar41._28_4_;
              auVar44._4_4_ = fVar7 * local_920._4_4_;
              auVar44._0_4_ = fVar7 * local_920._0_4_;
              auVar44._8_4_ = fVar7 * local_920._8_4_;
              auVar44._12_4_ = fVar7 * local_920._12_4_;
              auVar44._16_4_ = fVar7 * local_920._16_4_;
              auVar44._20_4_ = fVar7 * local_920._20_4_;
              auVar44._24_4_ = fVar7 * local_920._24_4_;
              auVar44._28_4_ = fVar7;
              auVar23 = vfmadd213ps_fma(auVar66,local_940,auVar44);
              auVar23 = vfmadd213ps_fma(auVar64,local_960,ZEXT1632(auVar23));
              auVar49 = ZEXT1632(CONCAT412(auVar23._12_4_ + auVar23._12_4_,
                                           CONCAT48(auVar23._8_4_ + auVar23._8_4_,
                                                    CONCAT44(auVar23._4_4_ + auVar23._4_4_,
                                                             auVar23._0_4_ + auVar23._0_4_))));
              auVar45._0_4_ = auVar33._0_4_ * local_920._0_4_;
              auVar45._4_4_ = auVar33._4_4_ * local_920._4_4_;
              auVar45._8_4_ = auVar33._8_4_ * local_920._8_4_;
              auVar45._12_4_ = auVar33._12_4_ * local_920._12_4_;
              auVar45._16_4_ = auVar33._16_4_ * local_920._16_4_;
              auVar45._20_4_ = auVar33._20_4_ * local_920._20_4_;
              auVar45._24_4_ = auVar33._24_4_ * local_920._24_4_;
              auVar45._28_4_ = 0;
              auVar23 = vfmadd213ps_fma(auVar32,local_940,auVar45);
              auVar29 = vfmadd213ps_fma(auVar52,local_960,ZEXT1632(auVar23));
              auVar52 = vrcp14ps_avx512vl(auVar49);
              auVar30._8_4_ = 0x3f800000;
              auVar30._0_8_ = 0x3f8000003f800000;
              auVar30._12_4_ = 0x3f800000;
              auVar30._16_4_ = 0x3f800000;
              auVar30._20_4_ = 0x3f800000;
              auVar30._24_4_ = 0x3f800000;
              auVar30._28_4_ = 0x3f800000;
              auVar30 = vfnmadd213ps_avx512vl(auVar52,auVar49,auVar30);
              auVar23 = vfmadd132ps_fma(auVar30,auVar52,auVar52);
              local_8a0 = ZEXT1632(CONCAT412((auVar29._12_4_ + auVar29._12_4_) * auVar23._12_4_,
                                             CONCAT48((auVar29._8_4_ + auVar29._8_4_) *
                                                      auVar23._8_4_,
                                                      CONCAT44((auVar29._4_4_ + auVar29._4_4_) *
                                                               auVar23._4_4_,
                                                               (auVar29._0_4_ + auVar29._0_4_) *
                                                               auVar23._0_4_))));
              uVar57 = *(undefined4 *)((long)&(local_b68->org).field_0 + 0xc);
              auVar42._4_4_ = uVar57;
              auVar42._0_4_ = uVar57;
              auVar42._8_4_ = uVar57;
              auVar42._12_4_ = uVar57;
              auVar42._16_4_ = uVar57;
              auVar42._20_4_ = uVar57;
              auVar42._24_4_ = uVar57;
              auVar42._28_4_ = uVar57;
              uVar9 = vcmpps_avx512vl(local_8a0,auVar42,0xd);
              auVar52 = vxorps_avx512vl(auVar49,auVar31);
              fVar7 = local_b68->tfar;
              auVar43._4_4_ = fVar7;
              auVar43._0_4_ = fVar7;
              auVar43._8_4_ = fVar7;
              auVar43._12_4_ = fVar7;
              auVar43._16_4_ = fVar7;
              auVar43._20_4_ = fVar7;
              auVar43._24_4_ = fVar7;
              auVar43._28_4_ = fVar7;
              uVar10 = vcmpps_avx512vl(local_8a0,auVar43,2);
              uVar12 = vcmpps_avx512vl(auVar49,auVar52,4);
              local_900 = (byte)uVar9 & (byte)uVar10 & (byte)uVar12 & local_900;
              if (local_900 == 0) goto LAB_00684478;
              local_820 = 0xf0;
              auVar59._8_4_ = 0x219392ef;
              auVar59._0_8_ = 0x219392ef219392ef;
              auVar59._12_4_ = 0x219392ef;
              auVar59._16_4_ = 0x219392ef;
              auVar59._20_4_ = 0x219392ef;
              auVar59._24_4_ = 0x219392ef;
              auVar59._28_4_ = 0x219392ef;
              uVar16 = vcmpps_avx512vl(local_980,auVar59,5);
              auVar30 = vrcp14ps_avx512vl(local_980);
              auVar65._8_4_ = 0x3f800000;
              auVar65._0_8_ = 0x3f8000003f800000;
              auVar65._12_4_ = 0x3f800000;
              auVar65._16_4_ = 0x3f800000;
              auVar65._20_4_ = 0x3f800000;
              auVar65._24_4_ = 0x3f800000;
              auVar65._28_4_ = 0x3f800000;
              auVar23 = vfnmadd213ps_fma(local_980,auVar30,auVar65);
              auVar52 = vfmadd132ps_avx512vl(ZEXT1632(auVar23),auVar30,auVar30);
              fVar7 = (float)((uint)((byte)uVar16 & 1) * auVar52._0_4_);
              fVar1 = (float)((uint)((byte)(uVar16 >> 1) & 1) * auVar52._4_4_);
              fVar2 = (float)((uint)((byte)(uVar16 >> 2) & 1) * auVar52._8_4_);
              fVar3 = (float)((uint)((byte)(uVar16 >> 3) & 1) * auVar52._12_4_);
              fVar4 = (float)((uint)((byte)(uVar16 >> 4) & 1) * auVar52._16_4_);
              fVar5 = (float)((uint)((byte)(uVar16 >> 5) & 1) * auVar52._20_4_);
              fVar6 = (float)((uint)((byte)(uVar16 >> 6) & 1) * auVar52._24_4_);
              auVar46._4_4_ = fVar1 * local_9c0._4_4_;
              auVar46._0_4_ = fVar7 * local_9c0._0_4_;
              auVar46._8_4_ = fVar2 * local_9c0._8_4_;
              auVar46._12_4_ = fVar3 * local_9c0._12_4_;
              auVar46._16_4_ = fVar4 * local_9c0._16_4_;
              auVar46._20_4_ = fVar5 * local_9c0._20_4_;
              auVar46._24_4_ = fVar6 * local_9c0._24_4_;
              auVar46._28_4_ = local_9c0._28_4_;
              auVar52 = vminps_avx(auVar46,auVar65);
              auVar51._4_4_ = local_9a0._4_4_ * fVar1;
              auVar51._0_4_ = local_9a0._0_4_ * fVar7;
              auVar51._8_4_ = local_9a0._8_4_ * fVar2;
              auVar51._12_4_ = local_9a0._12_4_ * fVar3;
              auVar51._16_4_ = local_9a0._16_4_ * fVar4;
              auVar51._20_4_ = local_9a0._20_4_ * fVar5;
              auVar51._24_4_ = local_9a0._24_4_ * fVar6;
              auVar51._28_4_ = auVar30._28_4_;
              auVar30 = vminps_avx(auVar51,auVar65);
              auVar31 = vsubps_avx(auVar65,auVar52);
              auVar49 = vsubps_avx(auVar65,auVar30);
              local_8c0 = vblendps_avx(auVar30,auVar31,0xf0);
              local_8e0 = vblendps_avx(auVar52,auVar49,0xf0);
              local_880._4_4_ = local_960._4_4_ * 1.0;
              local_880._0_4_ = local_960._0_4_ * 1.0;
              local_880._8_4_ = local_960._8_4_ * 1.0;
              local_880._12_4_ = local_960._12_4_ * 1.0;
              local_880._16_4_ = local_960._16_4_ * -1.0;
              local_880._20_4_ = local_960._20_4_ * -1.0;
              local_880._24_4_ = local_960._24_4_ * -1.0;
              local_880._28_4_ = local_960._28_4_;
              local_860._4_4_ = local_940._4_4_ * 1.0;
              local_860._0_4_ = local_940._0_4_ * 1.0;
              local_860._8_4_ = local_940._8_4_ * 1.0;
              local_860._12_4_ = local_940._12_4_ * 1.0;
              local_860._16_4_ = local_940._16_4_ * -1.0;
              local_860._20_4_ = local_940._20_4_ * -1.0;
              local_860._24_4_ = local_940._24_4_ * -1.0;
              local_860._28_4_ = local_940._28_4_;
              local_840._4_4_ = local_920._4_4_ * 1.0;
              local_840._0_4_ = local_920._0_4_ * 1.0;
              local_840._8_4_ = local_920._8_4_ * 1.0;
              local_840._12_4_ = local_920._12_4_ * 1.0;
              local_840._16_4_ = local_920._16_4_ * -1.0;
              local_840._20_4_ = local_920._20_4_ * -1.0;
              local_840._24_4_ = local_920._24_4_ * -1.0;
              local_840._28_4_ = local_920._28_4_;
              local_ad0 = (ulong)local_900;
              auVar67 = ZEXT1664(local_b20);
              auVar68 = ZEXT1664(local_b30);
              auVar58 = ZEXT1664(local_b40);
              auVar63 = ZEXT1664(local_b50);
              local_ac8 = context->scene;
              do {
                local_b58 = 0;
                for (uVar16 = local_ad0; (uVar16 & 1) == 0;
                    uVar16 = uVar16 >> 1 | 0x8000000000000000) {
                  local_b58 = local_b58 + 1;
                }
                local_aa8 = *(uint *)((long)&local_9e0 + local_b58 * 4);
                local_b00 = (local_ac8->geometries).items[local_aa8].ptr;
                if ((local_b00->mask & local_b68->mask) == 0) {
                  local_ad0 = local_ad0 ^ 1L << (local_b58 & 0x3f);
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (local_b00->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_006844c2:
                    local_b68->tfar = -INFINITY;
                    return;
                  }
                  local_b60 = context->args;
                  local_a60 = auVar75._0_16_;
                  local_a50 = auVar74._0_16_;
                  local_a40 = auVar73._0_16_;
                  local_a30 = auVar72._0_16_;
                  local_a20 = auVar71._0_16_;
                  local_a10 = auVar70._0_16_;
                  uVar16 = (ulong)(uint)((int)local_b58 * 4);
                  local_a90.context = context->user;
                  local_ac0 = *(undefined4 *)(local_880 + uVar16);
                  local_abc = *(undefined4 *)(local_860 + uVar16);
                  local_ab8 = *(undefined4 *)(local_840 + uVar16);
                  local_ab4 = *(undefined4 *)(local_8e0 + uVar16);
                  local_ab0 = *(undefined4 *)(local_8c0 + uVar16);
                  local_aac = *(undefined4 *)((long)&local_a00 + uVar16);
                  local_aa4 = (local_a90.context)->instID[0];
                  local_aa0 = (local_a90.context)->instPrimID[0];
                  fVar60 = local_b68->tfar;
                  local_b68->tfar = *(float *)(local_8a0 + uVar16);
                  local_b6c = -1;
                  local_a90.valid = &local_b6c;
                  local_a90.geometryUserPtr = local_b00->userPtr;
                  local_a90.hit = (RTCHitN *)&local_ac0;
                  local_a90.N = 1;
                  local_a90.ray = (RTCRayN *)local_b68;
                  if (((local_b00->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                      ((*local_b00->occlusionFilterN)(&local_a90), *local_a90.valid != 0)) &&
                     ((local_b60->filter == (RTCFilterFunctionN)0x0 ||
                      ((((local_b60->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT &&
                        (((local_b00->field_8).field_0x2 & 0x40) == 0)) ||
                       ((*local_b60->filter)(&local_a90), *local_a90.valid != 0))))))
                  goto LAB_006844c2;
                  local_b68->tfar = fVar60;
                  local_ad0 = local_ad0 ^ 1L << (local_b58 & 0x3f);
                  auVar70 = ZEXT1664(local_a10);
                  auVar71 = ZEXT1664(local_a20);
                  auVar72 = ZEXT1664(local_a30);
                  auVar73 = ZEXT1664(local_a40);
                  auVar74 = ZEXT1664(local_a50);
                  auVar75 = ZEXT1664(local_a60);
                  auVar67 = ZEXT1664(local_b20);
                  auVar68 = ZEXT1664(local_b30);
                  auVar58 = ZEXT1664(local_b40);
                  auVar63 = ZEXT1664(local_b50);
                  fVar54 = local_b10;
                  fVar60 = fStack_b0c;
                  fVar61 = fStack_b08;
                  fVar62 = fStack_b04;
                }
              } while (local_ad0 != 0);
            }
            local_ae0 = local_ae0 + 1;
          } while (local_ae0 != local_ad8);
        }
LAB_006844aa:
      } while (local_ae8 != &local_800);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }